

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aems.cpp
# Opt level: O2

double despot::AEMS::AEMS2Likelihood(QNode *qnode)

{
  VNode *this;
  vector<despot::QNode_*,_std::allocator<despot::QNode_*>_> *pvVar1;
  QNode *this_00;
  QNode *this_01;
  ACT_TYPE action;
  ulong uVar2;
  double dVar3;
  double dVar4;
  
  this = QNode::parent(qnode);
  uVar2 = 0;
  this_01 = (QNode *)0x0;
  do {
    pvVar1 = VNode::children(this);
    if ((ulong)((long)(pvVar1->super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(pvVar1->super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar2) {
      if (this_01 == qnode) {
        dVar3 = 1.0;
      }
      else {
        dVar3 = 0.0;
      }
      return dVar3;
    }
    this_00 = VNode::Child(this,(ACT_TYPE)uVar2);
    if (this_01 == (QNode *)0x0) {
LAB_0016f03b:
      this_01 = this_00;
    }
    else {
      dVar3 = QNode::upper_bound(this_00);
      dVar4 = QNode::upper_bound(this_01);
      if (dVar4 < dVar3) goto LAB_0016f03b;
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

double AEMS::AEMS2Likelihood(QNode* qnode) {
	VNode* vnode = qnode->parent();
	QNode* qstar = NULL;
	for (ACT_TYPE action = 0; action < vnode->children().size(); action++) {
		QNode* child = vnode->Child(action);

		if (qstar == NULL || child->upper_bound() > qstar->upper_bound())
			qstar = child;
	}

	return qstar == qnode;
}